

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O0

bool __thiscall t_st_generator::is_vowel(t_st_generator *this,char c)

{
  int iVar1;
  char c_local;
  t_st_generator *this_local;
  
  iVar1 = tolower((int)c);
  if ((((iVar1 == 0x61) || (iVar1 == 0x65)) || (iVar1 == 0x69)) ||
     ((iVar1 == 0x6f || (iVar1 == 0x75)))) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool t_st_generator::is_vowel(char c) {
  switch (tolower(c)) {
  case 'a':
  case 'e':
  case 'i':
  case 'o':
  case 'u':
    return true;
  }
  return false;
}